

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_ExrMetadata_Test::TestBody(Image_ExrMetadata_Test *this)

{
  _Rb_tree_header *p_Var1;
  RGBColorSpace *expected;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar2;
  Allocator alloc;
  RGBColorSpace *actual;
  float *actual_00;
  SquareMatrix<4> *pSVar3;
  Bounds2<int> *expected_00;
  Point2<int> *expected_01;
  iterator iVar4;
  long lVar5;
  char *pcVar6;
  char *in_R9;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertHelper local_5c0;
  AssertionResult gtest_ar__1;
  AssertHelper local_5a8;
  AssertionResult gtest_ar_;
  Point2i fullRes;
  Bounds2i pb;
  string filename;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  stringVectors;
  ColorEncodingHandle local_518;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_510;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  SquareMatrix<4> local_4d0;
  SquareMatrix<4> local_490;
  ImageAndMetadata read;
  ImageMetadata outMetadata;
  Image image;
  
  GetFloatPixels(&rgbPixels,(Point2i)0x2000000010,3);
  outMetadata.renderTimeSeconds = (optional<float>)pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_510,&rgbPixels,(polymorphic_allocator<float> *)&outMetadata);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&read,"R",(allocator<char> *)&local_490);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)read.image.channelNames.field_2.fixed,"G",(allocator<char> *)&local_4d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(read.image.channelNames.field_2.fixed + 1),"B",
             (allocator<char> *)&stringVectors);
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&read;
  pbrt::Image::Image(&image,&local_510,(Point2i)0x2000000010,channels);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&read.image.format + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_510);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"metadata.exr",(allocator<char> *)&read);
  outMetadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &outMetadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
  outMetadata.renderTimeSeconds.set = false;
  outMetadata.cameraFromWorld.set = false;
  outMetadata.NDCFromWorld.set = false;
  outMetadata.pixelBounds.set = false;
  outMetadata.fullResolution.set = false;
  outMetadata.samplesPerPixel.set = false;
  outMetadata.MSE.set = false;
  outMetadata.colorSpace.set = false;
  outMetadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  outMetadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  outMetadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  outMetadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       outMetadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
            (&outMetadata.colorSpace,&pbrt::RGBColorSpace::Rec2020);
  read.image.format = 0x449a4000;
  pstd::optional<float>::operator=(&outMetadata.renderTimeSeconds,(float *)&read);
  p_Var1 = &stringVectors._M_t._M_impl.super__Rb_tree_header;
  stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pb.pMin.super_Tuple2<pbrt::Point2,_int>.x = 2;
  pb.pMin.super_Tuple2<pbrt::Point2,_int>.y = 10;
  pb.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0x12;
  pb.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0x2a;
  fullRes.super_Tuple2<pbrt::Point2,_int>.x = 1000;
  fullRes.super_Tuple2<pbrt::Point2,_int>.y = 200;
  local_490.m[0][0] = 3.0;
  local_490.m[0][1] = 1.0;
  local_490.m[0][2] = 4.0;
  local_490.m[0][3] = 1.0;
  local_490.m[1][0] = 5.0;
  local_490.m[1][1] = 9.0;
  local_490.m[1][2] = 2.0;
  local_490.m[1][3] = 3.1415927;
  local_490.m[2][0] = 2.0;
  local_490.m[2][1] = 7.0;
  local_490.m[2][2] = 1.0;
  local_490.m[2][3] = 8.0;
  local_490.m[3][0] = 2.0;
  local_490.m[3][1] = 8.0;
  local_490.m[3][2] = 1.0;
  local_490.m[3][3] = 2.7182817;
  local_4d0.m[0][0] = 1.5;
  local_4d0.m[0][1] = 2.5;
  local_4d0.m[0][2] = 3.5;
  local_4d0.m[0][3] = 4.75;
  local_4d0.m[1][0] = 5.333;
  local_4d0.m[1][1] = 6.2135;
  local_4d0.m[1][2] = -351.2;
  local_4d0.m[1][3] = -552.0;
  local_4d0.m[2][0] = 63.2;
  local_4d0.m[2][1] = 47.2;
  local_4d0.m[2][2] = 3.1415927;
  local_4d0.m[2][3] = 0.5403023;
  local_4d0.m[3][0] = 0.0;
  local_4d0.m[3][1] = -14.0;
  local_4d0.m[3][2] = 6.0;
  local_4d0.m[3][3] = 1e-10;
  stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&read,"foo",(allocator<char> *)&gtest_ar__1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)read.image.channelNames.field_2.fixed,"bar",(allocator<char> *)&local_5c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"yolo",(allocator<char> *)&local_5a8);
  pvVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[](&stringVectors,(key_type *)&gtest_ar_);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            (pvVar2,&read,(undefined1 *)((long)&read.image.channelNames.field_2 + 0x20));
  std::__cxx11::string::~string((string *)&gtest_ar_);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&read.image.format + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=(&outMetadata.cameraFromWorld,&local_490);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=(&outMetadata.NDCFromWorld,&local_4d0);
  pstd::optional<pbrt::Bounds2<int>_>::operator=(&outMetadata.pixelBounds,&pb);
  pstd::optional<pbrt::Point2<int>_>::operator=(&outMetadata.fullResolution,&fullRes);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::operator=(&outMetadata.stringVectors._M_t,&stringVectors._M_t);
  gtest_ar_.success_ = pbrt::Image::Write(&image,&filename,&outMetadata);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&read,(internal *)&gtest_ar_,
               (AssertionResult *)"image.Write(filename, outMetadata)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1ad,(char *)CONCAT44(read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x,
                                       read.image.format));
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    std::__cxx11::string::~string((string *)&read);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_518.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&read,&filename,alloc,&local_518);
  expected = pbrt::RGBColorSpace::Rec2020;
  actual = pbrt::ImageMetadata::GetColorSpace(&read.metadata);
  testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
            ((internal *)&gtest_ar_,"*RGBColorSpace::Rec2020","*inMetadata.GetColorSpace()",expected
             ,actual);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1.success_ = read.metadata.renderTimeSeconds.set;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (read.metadata.renderTimeSeconds.set == false) {
    testing::Message::Message((Message *)&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"(bool)inMetadata.renderTimeSeconds","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b4,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar__1._0_4_ = 0x4d2;
  actual_00 = pstd::optional<float>::value(&read.metadata.renderTimeSeconds);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&gtest_ar_,"1234","*inMetadata.renderTimeSeconds",(int *)&gtest_ar__1,
             actual_00);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1.success_ = read.metadata.cameraFromWorld.set;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (read.metadata.cameraFromWorld.set == false) {
    testing::Message::Message((Message *)&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"(bool)inMetadata.cameraFromWorld","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b7,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  pSVar3 = pstd::optional<pbrt::SquareMatrix<4>_>::value(&read.metadata.cameraFromWorld);
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
            ((internal *)&gtest_ar_,"*inMetadata.cameraFromWorld","w2c",pSVar3,&local_490);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1b8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1.success_ = read.metadata.NDCFromWorld.set;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (read.metadata.NDCFromWorld.set == false) {
    testing::Message::Message((Message *)&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"(bool)inMetadata.NDCFromWorld","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1ba,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  pSVar3 = pstd::optional<pbrt::SquareMatrix<4>_>::value(&read.metadata.NDCFromWorld);
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
            ((internal *)&gtest_ar_,"*inMetadata.NDCFromWorld","w2n",pSVar3,&local_4d0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1bb,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1.success_ = read.metadata.pixelBounds.set;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (read.metadata.pixelBounds.set == false) {
    testing::Message::Message((Message *)&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"(bool)inMetadata.pixelBounds","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1bd,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  expected_00 = pstd::optional<pbrt::Bounds2<int>_>::value(&read.metadata.pixelBounds);
  testing::internal::CmpHelperEQ<pbrt::Bounds2<int>,pbrt::Bounds2<int>>
            ((internal *)&gtest_ar_,"*inMetadata.pixelBounds","pb",expected_00,&pb);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1be,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1.success_ = read.metadata.fullResolution.set;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (read.metadata.fullResolution.set == false) {
    testing::Message::Message((Message *)&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"(bool)inMetadata.fullResolution","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c0,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  expected_01 = pstd::optional<pbrt::Point2<int>_>::value(&read.metadata.fullResolution);
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)&gtest_ar_,"*inMetadata.fullResolution","fullRes",expected_01,&fullRes);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_5c0.data_._0_4_ = 1;
  gtest_ar__1._0_8_ = read.metadata.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_,"1","inMetadata.stringVectors.size()",(int *)&local_5c0,
             (unsigned_long *)&gtest_ar__1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c3,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_,"yolo",(allocator<char> *)&gtest_ar__1);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&stringVectors._M_t,(key_type *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__1.success_ = (_Rb_tree_header *)iVar4._M_node != p_Var1;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    testing::Message::Message((Message *)&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"iter != stringVectors.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c5,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_,"\"foo\"","iter->second[0]",(char (*) [4])"foo",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (iVar4._M_node + 2));
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_,"\"bar\"","iter->second[1]",(char (*) [4])"bar",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(iVar4._M_node + 2) + 0x20));
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__1._0_8_ = gtest_ar__1._0_8_ & 0xffffffff00000000;
  local_5c0.data_._0_4_ = remove(filename._M_dataplus._M_p);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_,"0","remove(filename.c_str())",(int *)&gtest_ar__1,
             (int *)&local_5c0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x1c9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  pbrt::ImageAndMetadata::~ImageAndMetadata(&read);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&stringVectors._M_t);
  pbrt::ImageMetadata::~ImageMetadata(&outMetadata);
  std::__cxx11::string::~string((string *)&filename);
  pbrt::Image::~Image(&image);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&rgbPixels);
  return;
}

Assistant:

TEST(Image, ExrMetadata) {
    Point2i res(16, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);
    Image image(rgbPixels, res, {"R", "G", "B"});

    std::string filename = "metadata.exr";
    ImageMetadata outMetadata;
    outMetadata.colorSpace = RGBColorSpace::Rec2020;
    outMetadata.renderTimeSeconds = 1234;
    SquareMatrix<4> w2c(3, 1, 4, 1, 5, 9, 2, Pi, 2, 7, 1, 8, 2, 8, 1, std::exp(1.f));
    SquareMatrix<4> w2n(1.5, 2.5, 3.5, 4.75, 5.333, 6.2135, -351.2, -552., 63.2, 47.2, Pi,
                        std::cos(1.f), 0, -14, 6, 1e-10f);
    // Must be the same area as image resolution.
    Bounds2i pb(Point2i(2, 10), Point2i(18, 42));
    Point2i fullRes(1000, 200);
    std::map<std::string, std::vector<std::string>> stringVectors;
    stringVectors["yolo"] = {"foo", "bar"};

    outMetadata.cameraFromWorld = w2c;
    outMetadata.NDCFromWorld = w2n;
    outMetadata.pixelBounds = pb;
    outMetadata.fullResolution = fullRes;
    outMetadata.stringVectors = stringVectors;
    EXPECT_TRUE(image.Write(filename, outMetadata));

    ImageAndMetadata read = Image::Read(filename);
    ImageMetadata &inMetadata = read.metadata;

    EXPECT_EQ(*RGBColorSpace::Rec2020, *inMetadata.GetColorSpace());

    EXPECT_TRUE((bool)inMetadata.renderTimeSeconds);
    EXPECT_EQ(1234, *inMetadata.renderTimeSeconds);

    EXPECT_TRUE((bool)inMetadata.cameraFromWorld);
    EXPECT_EQ(*inMetadata.cameraFromWorld, w2c);

    EXPECT_TRUE((bool)inMetadata.NDCFromWorld);
    EXPECT_EQ(*inMetadata.NDCFromWorld, w2n);

    EXPECT_TRUE((bool)inMetadata.pixelBounds);
    EXPECT_EQ(*inMetadata.pixelBounds, pb);

    EXPECT_TRUE((bool)inMetadata.fullResolution);
    EXPECT_EQ(*inMetadata.fullResolution, fullRes);

    EXPECT_EQ(1, inMetadata.stringVectors.size());
    auto iter = stringVectors.find("yolo");
    EXPECT_TRUE(iter != stringVectors.end());
    EXPECT_EQ("foo", iter->second[0]);
    EXPECT_EQ("bar", iter->second[1]);

    EXPECT_EQ(0, remove(filename.c_str()));
}